

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

void * stbi__load_main(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri,
                      int bpc)

{
  ushort uVar1;
  undefined2 uVar2;
  float fVar3;
  undefined8 uVar4;
  int iVar5;
  int iVar6;
  char *pcVar7;
  float *__ptr;
  void *pvVar8;
  long lVar9;
  uint uVar10;
  int *piVar11;
  int iVar12;
  stbi_uc *psVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  int iVar17;
  stbi_uc *psVar18;
  undefined4 in_register_00000084;
  stbi__result_info *ri_00;
  uint uVar19;
  long lVar20;
  uint uVar21;
  float *pfVar22;
  void *pvVar23;
  long in_FS_OFFSET;
  float fVar24;
  double dVar25;
  undefined1 auVar26 [16];
  stbi__context *local_88f0;
  stbi__gif local_88a0;
  
  psVar18 = (stbi_uc *)CONCAT44(in_register_00000084,req_comp);
  ri->bits_per_channel = 8;
  ri->num_channels = 0;
  ri->channel_order = 0;
  ri_00 = ri;
  iVar5 = stbi__check_png_header(s);
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  if (iVar5 == 0) {
    iVar5 = stbi__gif_test(s);
    if (iVar5 != 0) {
      memset(&local_88a0,0,0x8870);
      local_88f0 = (stbi__context *)stbi__gif_load_next(s,&local_88a0,comp,0,psVar18);
      if (local_88f0 == (stbi__context *)0x0 || local_88f0 == s) {
        free(local_88a0.out);
        local_88f0 = (stbi__context *)0x0;
      }
      else {
        *x = local_88a0.w;
        *y = local_88a0.h;
        if ((req_comp & 0xfffffffbU) != 0) {
          local_88f0 = (stbi__context *)
                       stbi__convert_format
                                 ((uchar *)local_88f0,4,req_comp,local_88a0.w,local_88a0.h);
        }
      }
      free(local_88a0.history);
      local_88a0.out = local_88a0.background;
      goto LAB_0013bd10;
    }
    iVar5 = stbi__hdr_test(s);
    if (iVar5 == 0) {
      pcVar7 = "unknown image type";
    }
    else {
      piVar11 = comp;
      __ptr = stbi__hdr_load(s,x,y,comp,req_comp,ri_00);
      if (req_comp == 0) {
        req_comp = *comp;
      }
      if (__ptr == (float *)0x0) {
        return (void *)0x0;
      }
      iVar5 = *x;
      iVar17 = *y;
      pvVar8 = stbi__malloc_mad3(iVar5,iVar17,req_comp,(int)piVar11);
      if (pvVar8 != (void *)0x0) {
        uVar21 = ((req_comp & 1U) + req_comp) - 1;
        uVar19 = iVar17 * iVar5;
        uVar14 = 0;
        if ((int)uVar21 < 1) {
          uVar21 = 0;
        }
        lVar9 = (long)req_comp;
        if ((int)uVar19 < 1) {
          uVar19 = 0;
        }
        pfVar22 = __ptr;
        pvVar23 = pvVar8;
        for (; uVar14 != uVar19; uVar14 = uVar14 + 1) {
          for (uVar16 = 0; uVar21 != uVar16; uVar16 = uVar16 + 1) {
            dVar25 = pow((double)(pfVar22[uVar16] * stbi__h2l_scale_i),(double)stbi__h2l_gamma_i);
            fVar24 = (float)dVar25 * 255.0 + 0.5;
            fVar3 = 0.0;
            if (0.0 <= fVar24) {
              fVar3 = fVar24;
            }
            fVar24 = 255.0;
            if (fVar3 <= 255.0) {
              fVar24 = fVar3;
            }
            *(char *)((long)pvVar23 + uVar16) = (char)(int)fVar24;
          }
          if ((int)uVar21 < req_comp) {
            lVar20 = uVar14 * lVar9 + (ulong)uVar21;
            fVar24 = __ptr[lVar20] * 255.0 + 0.5;
            fVar3 = 0.0;
            if (0.0 <= fVar24) {
              fVar3 = fVar24;
            }
            fVar24 = 255.0;
            if (fVar3 <= 255.0) {
              fVar24 = fVar3;
            }
            *(char *)((long)pvVar8 + lVar20) = (char)(int)fVar24;
          }
          pvVar23 = (void *)((long)pvVar23 + lVar9);
          pfVar22 = pfVar22 + lVar9;
        }
        free(__ptr);
        return pvVar8;
      }
      free(__ptr);
      pcVar7 = "outofmem";
    }
  }
  else {
    if ((uint)req_comp < 5) {
      local_88a0._0_8_ = s;
      iVar5 = stbi__parse_png_file((stbi__png *)&local_88a0,0,req_comp);
      uVar4 = local_88a0._0_8_;
      if (iVar5 == 0) {
        local_88f0 = (stbi__context *)0x0;
      }
      else {
        if (local_88a0.flags < 9) {
          iVar5 = 8;
        }
        else {
          if (local_88a0.flags != 0x10) {
            pcVar7 = "bad bits_per_channel";
            goto LAB_0013b646;
          }
          iVar5 = 0x10;
        }
        ri->bits_per_channel = iVar5;
        local_88f0 = (stbi__context *)local_88a0.history;
        if ((req_comp != 0) && (iVar5 = *(int *)(local_88a0._0_8_ + 0xc), iVar5 != req_comp)) {
          uVar21 = *(stbi__uint32 *)local_88a0._0_8_;
          uVar19 = *(stbi__uint32 *)(local_88a0._0_8_ + 4);
          if (local_88a0.flags < 9) {
            local_88f0 = (stbi__context *)
                         stbi__convert_format(local_88a0.history,iVar5,req_comp,uVar21,uVar19);
          }
          else {
            local_88f0 = (stbi__context *)malloc((ulong)(req_comp * uVar21 * uVar19 * 2));
            if (local_88f0 == (stbi__context *)0x0) {
              free(local_88a0.history);
              *(char **)(in_FS_OFFSET + -0x10) = "outofmem";
              *(int *)(uVar4 + 0xc) = req_comp;
              return (void *)0x0;
            }
            iVar17 = req_comp + iVar5 * 8;
            uVar10 = 0;
            if ((int)uVar19 < 1) {
              uVar19 = 0;
            }
            iVar6 = uVar21 - 1;
            uVar14 = 0;
            for (uVar16 = 0; uVar16 != uVar19; uVar16 = uVar16 + 1) {
              if (0x19 < iVar17 - 10U) {
switchD_0013b9f5_caseD_d:
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_c_cmakelists/reidevries[P]batchglprocess/raylib-3.7.0/src/external/stb_image.h"
                              ,0x6fa,
                              "stbi__uint16 *stbi__convert_format16(stbi__uint16 *, int, int, unsigned int, unsigned int)"
                             );
              }
              uVar15 = (ulong)uVar10;
              iVar12 = uVar21 * (int)uVar16;
              psVar18 = (stbi_uc *)((long)local_88a0.history + 0x38) +
                        (ulong)(uint)(iVar12 * iVar5) * 2 + -0x38;
              psVar13 = local_88f0->buffer_start + (ulong)(uint)(iVar12 * req_comp) * 2 + -0x38;
              switch(iVar17) {
              case 10:
                lVar9 = 0;
                for (iVar12 = iVar6; -1 < iVar12; iVar12 = iVar12 + -1) {
                  *(undefined2 *)(local_88f0->buffer_start + lVar9 * 2 + uVar15 * 2 + -0x38) =
                       *(undefined2 *)
                        ((stbi_uc *)((long)local_88a0.history + 0x38) + lVar9 + uVar14 * 2 + -0x38);
                  (local_88f0->buffer_start + lVar9 * 2 + uVar15 * 2 + -0x36)[0] = 0xff;
                  (local_88f0->buffer_start + lVar9 * 2 + uVar15 * 2 + -0x36)[1] = 0xff;
                  lVar9 = lVar9 + 2;
                }
                break;
              case 0xb:
                psVar13 = local_88f0->buffer_start + uVar15 * 2 + -0x34;
                for (iVar12 = iVar6; -1 < iVar12; iVar12 = iVar12 + -1) {
                  uVar1 = *(ushort *)psVar18;
                  *(ushort *)psVar13 = uVar1;
                  *(ushort *)(psVar13 + -2) = uVar1;
                  *(ushort *)(psVar13 + -4) = uVar1;
                  psVar18 = psVar18 + 2;
                  psVar13 = psVar13 + 6;
                }
                break;
              case 0xc:
                lVar9 = 0;
                for (iVar12 = iVar6; -1 < iVar12; iVar12 = iVar12 + -1) {
                  auVar26._8_8_ = 0;
                  auVar26._0_8_ =
                       (ulong)*(ushort *)
                               ((stbi_uc *)((long)local_88a0.history + 0x38) +
                               lVar9 + uVar14 * 2 + -0x38) | 0xffff0000;
                  auVar26 = pshuflw(auVar26,auVar26,0x40);
                  *(long *)(local_88f0->buffer_start + lVar9 * 4 + uVar15 * 2 + -0x38) =
                       auVar26._0_8_;
                  lVar9 = lVar9 + 2;
                }
                break;
              default:
                goto switchD_0013b9f5_caseD_d;
              case 0x11:
                lVar9 = 0;
                for (iVar12 = iVar6; -1 < iVar12; iVar12 = iVar12 + -1) {
                  *(undefined2 *)(local_88f0->buffer_start + lVar9 + uVar15 * 2 + -0x38) =
                       *(undefined2 *)
                        ((stbi_uc *)((long)local_88a0.history + 0x38) +
                        lVar9 * 2 + uVar14 * 2 + -0x38);
                  lVar9 = lVar9 + 2;
                }
                break;
              case 0x13:
                psVar13 = local_88f0->buffer_start + uVar15 * 2 + -0x34;
                for (iVar12 = iVar6; -1 < iVar12; iVar12 = iVar12 + -1) {
                  uVar1 = *(ushort *)psVar18;
                  *(ushort *)psVar13 = uVar1;
                  *(ushort *)(psVar13 + -2) = uVar1;
                  *(ushort *)(psVar13 + -4) = uVar1;
                  psVar18 = psVar18 + 4;
                  psVar13 = psVar13 + 6;
                }
                break;
              case 0x14:
                lVar9 = uVar15 * 2;
                lVar20 = 0;
                for (iVar12 = iVar6; -1 < iVar12; iVar12 = iVar12 + -1) {
                  uVar2 = *(undefined2 *)
                           ((stbi_uc *)((long)local_88a0.history + 0x38) +
                           lVar20 + uVar14 * 2 + -0x38);
                  *(undefined2 *)(local_88f0->buffer_start + lVar20 * 2 + lVar9 + -0x34) = uVar2;
                  *(undefined2 *)(local_88f0->buffer_start + lVar20 * 2 + lVar9 + -0x36) = uVar2;
                  *(undefined2 *)(local_88f0->buffer_start + lVar20 * 2 + lVar9 + -0x38) = uVar2;
                  *(undefined2 *)(local_88f0->buffer_start + lVar20 * 2 + lVar9 + -0x32) =
                       *(undefined2 *)
                        ((stbi_uc *)((long)local_88a0.history + 0x38) + lVar20 + uVar14 * 2 + -0x36)
                  ;
                  lVar20 = lVar20 + 4;
                }
                break;
              case 0x19:
                for (iVar12 = iVar6; -1 < iVar12; iVar12 = iVar12 + -1) {
                  *(ushort *)psVar13 =
                       (ushort)((uint)*(ushort *)(psVar18 + 4) * 0x1d +
                                (uint)*(ushort *)(psVar18 + 2) * 0x96 +
                                (uint)*(ushort *)psVar18 * 0x4d >> 8);
                  psVar18 = psVar18 + 6;
                  psVar13 = psVar13 + 2;
                }
                break;
              case 0x1a:
                for (iVar12 = iVar6; -1 < iVar12; iVar12 = iVar12 + -1) {
                  *(ushort *)psVar13 =
                       (ushort)((uint)*(ushort *)(psVar18 + 4) * 0x1d +
                                (uint)*(ushort *)(psVar18 + 2) * 0x96 +
                                (uint)*(ushort *)psVar18 * 0x4d >> 8);
                  psVar13[2] = 0xff;
                  psVar13[3] = 0xff;
                  psVar18 = psVar18 + 6;
                  psVar13 = psVar13 + 4;
                }
                break;
              case 0x1c:
                for (iVar12 = iVar6; -1 < iVar12; iVar12 = iVar12 + -1) {
                  *(ushort *)psVar13 = *(ushort *)psVar18;
                  *(ushort *)(psVar13 + 2) = *(ushort *)(psVar18 + 2);
                  *(ushort *)(psVar13 + 4) = *(ushort *)(psVar18 + 4);
                  psVar13[6] = 0xff;
                  psVar13[7] = 0xff;
                  psVar18 = psVar18 + 6;
                  psVar13 = psVar13 + 8;
                }
                break;
              case 0x21:
                lVar9 = 0;
                for (iVar12 = iVar6; -1 < iVar12; iVar12 = iVar12 + -1) {
                  *(short *)(local_88f0->buffer_start + lVar9 + uVar15 * 2 + -0x38) =
                       (short)((uint)*(ushort *)
                                      ((stbi_uc *)((long)local_88a0.history + 0x38) +
                                      lVar9 * 4 + uVar14 * 2 + -0x34) * 0x1d +
                               (uint)*(ushort *)
                                      ((stbi_uc *)((long)local_88a0.history + 0x38) +
                                      lVar9 * 4 + uVar14 * 2 + -0x36) * 0x96 +
                               (uint)*(ushort *)
                                      ((stbi_uc *)((long)local_88a0.history + 0x38) +
                                      lVar9 * 4 + uVar14 * 2 + -0x38) * 0x4d >> 8);
                  lVar9 = lVar9 + 2;
                }
                break;
              case 0x22:
                lVar9 = 0;
                for (iVar12 = iVar6; -1 < iVar12; iVar12 = iVar12 + -1) {
                  *(short *)(local_88f0->buffer_start + lVar9 + uVar15 * 2 + -0x38) =
                       (short)((uint)*(ushort *)
                                      ((stbi_uc *)((long)local_88a0.history + 0x38) +
                                      lVar9 * 2 + uVar14 * 2 + -0x34) * 0x1d +
                               (uint)*(ushort *)
                                      ((stbi_uc *)((long)local_88a0.history + 0x38) +
                                      lVar9 * 2 + uVar14 * 2 + -0x36) * 0x96 +
                               (uint)*(ushort *)
                                      ((stbi_uc *)((long)local_88a0.history + 0x38) +
                                      lVar9 * 2 + uVar14 * 2 + -0x38) * 0x4d >> 8);
                  *(undefined2 *)(local_88f0->buffer_start + lVar9 + uVar15 * 2 + -0x36) =
                       *(undefined2 *)
                        ((stbi_uc *)((long)local_88a0.history + 0x38) +
                        lVar9 * 2 + uVar14 * 2 + -0x32);
                  lVar9 = lVar9 + 4;
                }
                break;
              case 0x23:
                for (iVar12 = iVar6; -1 < iVar12; iVar12 = iVar12 + -1) {
                  *(ushort *)psVar13 = *(ushort *)psVar18;
                  *(ushort *)(psVar13 + 2) = *(ushort *)(psVar18 + 2);
                  *(ushort *)(psVar13 + 4) = *(ushort *)(psVar18 + 4);
                  psVar18 = psVar18 + 8;
                  psVar13 = psVar13 + 6;
                }
              }
              uVar14 = (ulong)((int)uVar14 + iVar5 * uVar21);
              uVar10 = uVar10 + req_comp * uVar21;
            }
            free(local_88a0.history);
          }
          *(int *)(uVar4 + 0xc) = req_comp;
          if (local_88f0 == (stbi__context *)0x0) {
            return (void *)0x0;
          }
        }
        *x = *(stbi__uint32 *)uVar4;
        *y = *(stbi__uint32 *)(uVar4 + 4);
        if (comp != (int *)0x0) {
          *comp = *(int *)(uVar4 + 8);
        }
        local_88a0.history = (stbi_uc *)0x0;
      }
      free(local_88a0.history);
      free(local_88a0.background);
LAB_0013bd10:
      free(local_88a0.out);
      return local_88f0;
    }
    pcVar7 = "bad req_comp";
  }
LAB_0013b646:
  *(char **)(in_FS_OFFSET + -0x10) = pcVar7;
  return (void *)0x0;
}

Assistant:

static void *stbi__load_main(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri, int bpc)
{
   memset(ri, 0, sizeof(*ri)); // make sure it's initialized if we add new fields
   ri->bits_per_channel = 8; // default is 8 so most paths don't have to be changed
   ri->channel_order = STBI_ORDER_RGB; // all current input & output are this, but this is here so we can add BGR order
   ri->num_channels = 0;

   #ifndef STBI_NO_JPEG
   if (stbi__jpeg_test(s)) return stbi__jpeg_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PNG
   if (stbi__png_test(s))  return stbi__png_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_BMP
   if (stbi__bmp_test(s))  return stbi__bmp_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_GIF
   if (stbi__gif_test(s))  return stbi__gif_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PSD
   if (stbi__psd_test(s))  return stbi__psd_load(s,x,y,comp,req_comp, ri, bpc);
   #else
   STBI_NOTUSED(bpc);
   #endif
   #ifndef STBI_NO_PIC
   if (stbi__pic_test(s))  return stbi__pic_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PNM
   if (stbi__pnm_test(s))  return stbi__pnm_load(s,x,y,comp,req_comp, ri);
   #endif

   #ifndef STBI_NO_HDR
   if (stbi__hdr_test(s)) {
      float *hdr = stbi__hdr_load(s, x,y,comp,req_comp, ri);
      return stbi__hdr_to_ldr(hdr, *x, *y, req_comp ? req_comp : *comp);
   }
   #endif

   #ifndef STBI_NO_TGA
   // test tga last because it's a crappy test!
   if (stbi__tga_test(s))
      return stbi__tga_load(s,x,y,comp,req_comp, ri);
   #endif

   return stbi__errpuc("unknown image type", "Image not of any known type, or corrupt");
}